

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindTypeOfFunctionExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  reference this_00;
  pointer pEVar1;
  pointer *__ptr;
  undefined8 local_78;
  string local_70;
  Value local_50;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(input->children,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((byte)((pEVar1->return_type).id_ - SQLNULL) < 2) {
    *(undefined8 *)this = 0;
  }
  else {
    LogicalType::ToString_abi_cxx11_(&local_70,&pEVar1->return_type);
    Value::Value(&local_50,(string *)&local_70);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_78,&local_50);
    *(undefined8 *)this = local_78;
    local_78 = 0;
    Value::~Value(&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BindTypeOfFunctionExpression(FunctionBindExpressionInput &input) {
	auto &return_type = input.children[0]->return_type;
	if (return_type.id() == LogicalTypeId::UNKNOWN || return_type.id() == LogicalTypeId::SQLNULL) {
		// parameter - unknown return type
		return nullptr;
	}
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(Value(return_type.ToString()));
}